

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_inverted_15(void)

{
  run("inverted should not alter internal whitespace",
      " | {{^boolean}} {{! Important Whitespace }}\n {{/boolean}} | \n","{\"boolean\": false}",
      (char *)0x0," |  \n  | \n");
  return;
}

Assistant:

static void
test_inverted_15(void)
{
    run(
        "inverted should not alter internal whitespace",
        " | {{^boolean}} {{! Important Whitespace }}\n {{/boolean}} | \n",
        "{\"boolean\": false}",
        NULL,
        " |  \n  | \n"
    );
}